

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStdio.cpp
# Opt level: O3

void __thiscall
adios2::transport::FileStdio::Open
          (FileStdio *this,string *name,Mode openMode,bool async,bool directio)

{
  string *__rhs;
  undefined8 uVar1;
  undefined8 uVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  _Result<_IO_FILE_*> *this_00;
  int *piVar5;
  FILE *pFVar6;
  long *plVar7;
  size_type *psVar8;
  char *__modes;
  pointer pcVar9;
  _State_baseV2 *__tmp;
  shared_ptr<std::__future_base::_State_baseV2> __state;
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  element_type *local_98;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __rhs = &(this->super_Transport).m_Name;
  std::__cxx11::string::_M_assign((string *)__rhs);
  (*(this->super_Transport)._vptr_Transport[0x13])(this);
  (this->super_Transport).m_OpenMode = openMode;
  if (openMode == Append) {
    piVar5 = __errno_location();
    *piVar5 = 0;
    pFVar6 = fopen((name->_M_dataplus)._M_p,"rwb");
    this->m_File = (FILE *)pFVar6;
    fseek(pFVar6,0,2);
    goto LAB_00635890;
  }
  if (openMode == Read) {
    piVar5 = __errno_location();
    *piVar5 = 0;
    pcVar9 = (name->_M_dataplus)._M_p;
    __modes = "rb";
  }
  else {
    if (openMode != Write) {
      local_b8._0_8_ = (element_type *)(local_b8 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"Toolkit","");
      local_d8._0_8_ = (element_type *)(local_d8 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_d8,"transport::file::FileStdio","");
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Open","");
      std::operator+(&local_50,"unknown open mode for file ",__rhs);
      helper::Throw<std::ios_base::failure[abi:cxx11]>
                ((string *)local_b8,(string *)local_d8,&local_90,&local_50,-1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if ((element_type *)local_d8._0_8_ != (element_type *)(local_d8 + 0x10)) {
        operator_delete((void *)local_d8._0_8_);
      }
      if ((element_type *)local_b8._0_8_ != (element_type *)(local_b8 + 0x10)) {
        operator_delete((void *)local_b8._0_8_);
      }
      goto LAB_00635890;
    }
    if (async) {
      this->m_IsOpening = true;
      local_b8._0_8_ = (element_type *)0x0;
      local_b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x68);
      p_Var4->_M_use_count = 1;
      p_Var4->_M_weak_count = 1;
      p_Var4->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_008736c0;
      local_98 = (element_type *)(p_Var4 + 1);
      p_Var4[1]._M_use_count = 0;
      p_Var4[1]._M_weak_count = 0;
      *(undefined4 *)&p_Var4[2]._vptr__Sp_counted_base = 0;
      *(undefined1 *)((long)&p_Var4[2]._vptr__Sp_counted_base + 4) = 0;
      p_Var4[2]._M_use_count = 0;
      p_Var4[3]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var4[3]._M_use_count = 0;
      p_Var4[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_00873710;
      this_00 = (_Result<_IO_FILE_*> *)operator_new(0x20);
      std::__future_base::_Result<_IO_FILE_*>::_Result(this_00);
      p_Var4[4]._vptr__Sp_counted_base = (_func_int **)this_00;
      *(_Atomic_word **)&p_Var4[4]._M_use_count = &p_Var4[5]._M_use_count;
      pcVar9 = (name->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&p_Var4[4]._M_use_count,pcVar9,pcVar9 + name->_M_string_length);
      peVar3 = local_98;
      local_d8._0_8_ = (element_type *)0x0;
      local_90._M_dataplus._M_p = (pointer)operator_new(0x20);
      *(undefined ***)local_90._M_dataplus._M_p = &PTR___State_00873768;
      *(element_type **)((long)local_90._M_dataplus._M_p + 8) = peVar3;
      *(code **)((long)local_90._M_dataplus._M_p + 0x10) =
           std::__future_base::
           _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/transport/file/FileStdio.cpp:62:30),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,__IO_FILE_*>
           ::_M_run;
      *(size_type *)((long)local_90._M_dataplus._M_p + 0x18) = 0;
      std::thread::_M_start_thread(local_d8,&local_90,0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_90._M_dataplus._M_p + 8))();
      }
      if (p_Var4[3]._vptr__Sp_counted_base != (_func_int **)0x0) {
        std::terminate();
      }
      p_Var4[3]._vptr__Sp_counted_base = (_func_int **)local_d8._0_8_;
      local_b8._0_8_ = peVar3;
      local_b8._8_8_ = p_Var4;
      std::__basic_future<_IO_FILE_*>::__basic_future
                ((__basic_future<_IO_FILE_*> *)local_d8,(__state_type *)local_b8);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
      }
      uVar2 = local_d8._8_8_;
      uVar1 = local_d8._0_8_;
      local_d8._0_8_ = (element_type *)0x0;
      local_d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var4 = (this->m_OpenFuture).super___basic_future<_IO_FILE_*>._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (this->m_OpenFuture).super___basic_future<_IO_FILE_*>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)uVar1;
      (this->m_OpenFuture).super___basic_future<_IO_FILE_*>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2;
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
        }
      }
      goto LAB_00635890;
    }
    piVar5 = __errno_location();
    *piVar5 = 0;
    pcVar9 = (name->_M_dataplus)._M_p;
    __modes = "wb";
  }
  pFVar6 = fopen(pcVar9,__modes);
  this->m_File = (FILE *)pFVar6;
LAB_00635890:
  if (this->m_IsOpening == false) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                   "couldn\'t open file ",__rhs);
    plVar7 = (long *)std::__cxx11::string::append((char *)local_b8);
    psVar8 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_70.field_2._M_allocated_capacity = *psVar8;
      local_70.field_2._8_8_ = plVar7[3];
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    }
    else {
      local_70.field_2._M_allocated_capacity = *psVar8;
      local_70._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_70._M_string_length = plVar7[1];
    *plVar7 = (long)psVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    CheckFile(this,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((element_type *)local_b8._0_8_ != (element_type *)(local_b8 + 0x10)) {
      operator_delete((void *)local_b8._0_8_);
    }
    (this->super_Transport).m_IsOpen = true;
  }
  return;
}

Assistant:

void FileStdio::Open(const std::string &name, const Mode openMode, const bool async,
                     const bool directio)
{
    auto lf_AsyncOpenWrite = [&](const std::string &name) -> FILE * {
        errno = 0;
        return std::fopen(name.c_str(), "wb");
    };
    m_Name = name;
    CheckName();
    m_OpenMode = openMode;

    switch (m_OpenMode)
    {
    case Mode::Write:
        if (async)
        {
            m_IsOpening = true;
            m_OpenFuture = std::async(std::launch::async, lf_AsyncOpenWrite, name);
        }
        else
        {
            errno = 0;
            m_File = std::fopen(name.c_str(), "wb");
        }
        break;
    case Mode::Append:
        errno = 0;
        m_File = std::fopen(name.c_str(), "rwb");
        std::fseek(m_File, 0, SEEK_END);
        break;
    case Mode::Read:
        errno = 0;
        m_File = std::fopen(name.c_str(), "rb");
        break;
    default:
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileStdio", "Open",
                                              "unknown open mode for file " + m_Name);
    }

    if (!m_IsOpening)
    {
        CheckFile("couldn't open file " + m_Name +
                  ", check permissions or path existence, in call to stdio open");
        m_IsOpen = true;
    }
}